

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMDisassembler.c
# Opt level: O2

DecodeStatus DecodeVSTInstruction(MCInst *Inst,uint Insn,uint64_t Address,void *Decoder)

{
  uint uVar1;
  uint uVar2;
  DecodeStatus DVar3;
  DecodeStatus DVar4;
  void *pvVar5;
  uint64_t extraout_RDX;
  uint64_t extraout_RDX_00;
  uint64_t extraout_RDX_01;
  uint64_t extraout_RDX_02;
  uint64_t uVar6;
  uint64_t Address_00;
  uint64_t extraout_RDX_03;
  uint64_t extraout_RDX_04;
  uint64_t Address_01;
  uint uVar7;
  uint RegNo;
  
  RegNo = Insn >> 0x10 & 0xf;
  uVar7 = Insn & 0xf;
  uVar2 = MCInst_getOpcode(Inst);
  DVar3 = MCDisassembler_Success;
  uVar6 = extraout_RDX;
  if (uVar2 - 0x761 < 0x7b) {
    pvVar5 = (void *)((long)&switchD_00154d08::switchdataD_001cc2a0 +
                     (long)(int)(&switchD_00154d08::switchdataD_001cc2a0)[uVar2 - 0x761]);
    switch(uVar2) {
    case 0x761:
    case 0x762:
    case 0x764:
    case 0x765:
    case 0x766:
    case 0x767:
    case 0x76a:
    case 0x76b:
    case 0x76d:
    case 0x76e:
    case 0x76f:
    case 0x770:
    case 0x776:
    case 0x777:
    case 0x77c:
    case 0x77d:
    case 0x77e:
    case 0x77f:
    case 0x782:
    case 0x783:
    case 0x785:
    case 0x786:
    case 0x787:
    case 0x788:
    case 0x78a:
    case 0x78b:
    case 0x78d:
    case 0x78e:
    case 0x790:
    case 0x791:
    case 0x793:
    case 0x794:
    case 0x7b9:
    case 0x7ba:
    case 0x7bc:
    case 0x7bd:
    case 0x7bf:
    case 0x7c0:
    case 0x7c2:
    case 0x7c3:
    case 0x7c5:
    case 0x7c6:
    case 0x7c8:
    case 0x7c9:
    case 0x7ce:
    case 1999:
    case 0x7d4:
    case 0x7d5:
    case 0x7da:
    case 0x7db:
      if (uVar7 == 0xf) goto LAB_00154fa8;
      MCOperand_CreateImm0(Inst,0);
      uVar6 = extraout_RDX_00;
    }
switchD_00154d08_caseD_763:
    DVar4 = DecodeAddrMode6Operand(Inst,RegNo | Insn & 0x30,uVar6,pvVar5);
    if (DVar4 != MCDisassembler_Success) {
      if (DVar4 != MCDisassembler_SoftFail) goto LAB_00154fa8;
      DVar3 = MCDisassembler_SoftFail;
    }
    uVar2 = MCInst_getOpcode(Inst);
    pvVar5 = (void *)(ulong)(uVar2 - 0x761);
    uVar6 = extraout_RDX_02;
    if (((0x32 < uVar2 - 0x761) ||
        (uVar6 = 0x4925228205229, (0x4925228205229U >> ((ulong)pvVar5 & 0x3f) & 1) == 0)) &&
       (((0x21 < uVar2 - 0x7b9 ||
         (pvVar5 = (void *)0x208209249, (0x208209249U >> ((ulong)(uVar2 - 0x7b9) & 0x3f) & 1) == 0))
        && (uVar7 != 0xf)))) {
      if (uVar7 == 0xd) {
        MCOperand_CreateReg0(Inst,0);
      }
      else {
        DVar4 = DecodeGPRRegisterClass(Inst,uVar7,uVar6,pvVar5);
        if (DVar4 != MCDisassembler_Success) {
          if (DVar4 != MCDisassembler_SoftFail) goto LAB_00154fa8;
          DVar3 = MCDisassembler_SoftFail;
        }
      }
    }
    uVar7 = Insn >> 0x12 & 0x10 | Insn >> 0xc & 0xf;
    uVar2 = MCInst_getOpcode(Inst);
    pvVar5 = (void *)(ulong)(uVar2 - 0x789);
    if (uVar2 - 0x789 < 0xc) {
LAB_00154e0d:
      DVar4 = DecodeDPairRegisterClass(Inst,uVar7,Address_00,pvVar5);
    }
    else {
      pvVar5 = (void *)(ulong)(uVar2 - 0x7b8);
      if (uVar2 - 0x7b8 < 9) {
        DVar4 = DecodeDPairSpacedRegisterClass(Inst,uVar7,Address_00,pvVar5);
      }
      else {
        if (uVar2 - 0x7c1 < 9) goto LAB_00154e0d;
        DVar4 = DecodeDPRRegisterClass(Inst,uVar7,Address_00,pvVar5);
      }
    }
    if (DVar4 != MCDisassembler_Success) {
      if (DVar4 != MCDisassembler_SoftFail) goto LAB_00154fa8;
      DVar3 = MCDisassembler_SoftFail;
    }
    uVar2 = MCInst_getOpcode(Inst);
    pvVar5 = (void *)(ulong)(uVar2 - 0x7ff);
    uVar6 = extraout_RDX_03;
    if (uVar2 - 0x7ff < 0x22) {
      uVar6 = 0x999;
      if ((0x999UL >> ((ulong)pvVar5 & 0x3f) & 1) == 0) {
        if ((0x294a00000U >> ((ulong)pvVar5 & 0x3f) & 1) == 0) goto LAB_00154e64;
LAB_00154e7f:
        uVar2 = uVar7 + 2;
      }
      else {
LAB_00154e85:
        uVar2 = uVar7 + 1;
      }
      DVar4 = DecodeDPRRegisterClass(Inst,uVar2 & 0x1f,uVar6,pvVar5);
      if (DVar4 != MCDisassembler_Success) {
        if (DVar4 != MCDisassembler_SoftFail) goto LAB_00154fa8;
        DVar3 = MCDisassembler_SoftFail;
      }
    }
    else {
LAB_00154e64:
      uVar2 = uVar2 - 0x84f;
      if (uVar2 < 0x22) {
        pvVar5 = (void *)0x999;
        if ((0x999UL >> ((ulong)uVar2 & 0x3f) & 1) != 0) goto LAB_00154e85;
        if ((0x294a00000U >> ((ulong)uVar2 & 0x3f) & 1) != 0) goto LAB_00154e7f;
      }
    }
    uVar2 = MCInst_getOpcode(Inst);
    pvVar5 = (void *)(ulong)(uVar2 - 0x7ff);
    uVar6 = extraout_RDX_04;
    if (uVar2 - 0x7ff < 0x22) {
      uVar6 = 0x999;
      if ((0x999UL >> ((ulong)pvVar5 & 0x3f) & 1) == 0) {
        if ((0x294a00000U >> ((ulong)pvVar5 & 0x3f) & 1) == 0) goto LAB_00154ec9;
LAB_00154ee4:
        uVar2 = uVar7 + 4;
      }
      else {
LAB_00154eea:
        uVar2 = uVar7 + 2;
      }
      DVar4 = DecodeDPRRegisterClass(Inst,uVar2 & 0x1f,uVar6,pvVar5);
      if (DVar4 != MCDisassembler_Success) {
        if (DVar4 != MCDisassembler_SoftFail) goto LAB_00154fa8;
        DVar3 = MCDisassembler_SoftFail;
      }
    }
    else {
LAB_00154ec9:
      uVar2 = uVar2 - 0x84f;
      if (uVar2 < 0x22) {
        pvVar5 = (void *)0x999;
        if ((0x999UL >> ((ulong)uVar2 & 0x3f) & 1) != 0) goto LAB_00154eea;
        if ((0x294a00000U >> ((ulong)uVar2 & 0x3f) & 1) != 0) goto LAB_00154ee4;
      }
    }
    uVar2 = MCInst_getOpcode(Inst);
    uVar2 = uVar2 - 0x84f;
    if (uVar2 < 0x22) {
      if ((0x999UL >> ((ulong)uVar2 & 0x3f) & 1) == 0) {
        if ((0x294a00000U >> ((ulong)uVar2 & 0x3f) & 1) == 0) {
          return DVar3;
        }
        uVar7 = uVar7 + 6;
      }
      else {
        uVar7 = uVar7 + 3;
      }
      DVar4 = DecodeDPRRegisterClass(Inst,uVar7 & 0x1f,Address_01,(void *)0x999);
      if ((DVar4 != MCDisassembler_Success) &&
         (DVar3 = MCDisassembler_Fail, DVar4 == MCDisassembler_SoftFail)) {
        DVar3 = MCDisassembler_SoftFail;
      }
    }
  }
  else {
    uVar1 = uVar2 - 0x802;
    pvVar5 = (void *)(ulong)uVar1;
    if ((((0x1e < uVar1) || (uVar6 = 0x42100111, (0x42100111U >> (uVar1 & 0x1f) & 1) == 0)) &&
        ((0x1e < uVar2 - 0x852 ||
         (pvVar5 = (void *)0x42100111, (0x42100111U >> (uVar2 - 0x852 & 0x1f) & 1) == 0)))) ||
       (DVar3 = DecodeGPRRegisterClass(Inst,RegNo,uVar6,pvVar5), uVar6 = extraout_RDX_01,
       (DVar3 | 2) == MCDisassembler_Success)) goto switchD_00154d08_caseD_763;
LAB_00154fa8:
    DVar3 = MCDisassembler_Fail;
  }
  return DVar3;
}

Assistant:

static DecodeStatus DecodeVSTInstruction(MCInst *Inst, unsigned Insn,
		uint64_t Address, const void *Decoder)
{
	DecodeStatus S = MCDisassembler_Success;
	unsigned wb, Rn, Rm;
	unsigned Rd = fieldFromInstruction_4(Insn, 12, 4);
	Rd |= fieldFromInstruction_4(Insn, 22, 1) << 4;
	wb = fieldFromInstruction_4(Insn, 16, 4);
	Rn = fieldFromInstruction_4(Insn, 16, 4);
	Rn |= fieldFromInstruction_4(Insn, 4, 2) << 4;
	Rm = fieldFromInstruction_4(Insn, 0, 4);

	// Writeback Operand
	switch (MCInst_getOpcode(Inst)) {
		case ARM_VST1d8wb_fixed:
		case ARM_VST1d16wb_fixed:
		case ARM_VST1d32wb_fixed:
		case ARM_VST1d64wb_fixed:
		case ARM_VST1d8wb_register:
		case ARM_VST1d16wb_register:
		case ARM_VST1d32wb_register:
		case ARM_VST1d64wb_register:
		case ARM_VST1q8wb_fixed:
		case ARM_VST1q16wb_fixed:
		case ARM_VST1q32wb_fixed:
		case ARM_VST1q64wb_fixed:
		case ARM_VST1q8wb_register:
		case ARM_VST1q16wb_register:
		case ARM_VST1q32wb_register:
		case ARM_VST1q64wb_register:
		case ARM_VST1d8Twb_fixed:
		case ARM_VST1d16Twb_fixed:
		case ARM_VST1d32Twb_fixed:
		case ARM_VST1d64Twb_fixed:
		case ARM_VST1d8Twb_register:
		case ARM_VST1d16Twb_register:
		case ARM_VST1d32Twb_register:
		case ARM_VST1d64Twb_register:
		case ARM_VST1d8Qwb_fixed:
		case ARM_VST1d16Qwb_fixed:
		case ARM_VST1d32Qwb_fixed:
		case ARM_VST1d64Qwb_fixed:
		case ARM_VST1d8Qwb_register:
		case ARM_VST1d16Qwb_register:
		case ARM_VST1d32Qwb_register:
		case ARM_VST1d64Qwb_register:
		case ARM_VST2d8wb_fixed:
		case ARM_VST2d16wb_fixed:
		case ARM_VST2d32wb_fixed:
		case ARM_VST2d8wb_register:
		case ARM_VST2d16wb_register:
		case ARM_VST2d32wb_register:
		case ARM_VST2q8wb_fixed:
		case ARM_VST2q16wb_fixed:
		case ARM_VST2q32wb_fixed:
		case ARM_VST2q8wb_register:
		case ARM_VST2q16wb_register:
		case ARM_VST2q32wb_register:
		case ARM_VST2b8wb_fixed:
		case ARM_VST2b16wb_fixed:
		case ARM_VST2b32wb_fixed:
		case ARM_VST2b8wb_register:
		case ARM_VST2b16wb_register:
		case ARM_VST2b32wb_register:
			if (Rm == 0xF)
				return MCDisassembler_Fail;
			MCOperand_CreateImm0(Inst, 0);
			break;
		case ARM_VST3d8_UPD:
		case ARM_VST3d16_UPD:
		case ARM_VST3d32_UPD:
		case ARM_VST3q8_UPD:
		case ARM_VST3q16_UPD:
		case ARM_VST3q32_UPD:
		case ARM_VST4d8_UPD:
		case ARM_VST4d16_UPD:
		case ARM_VST4d32_UPD:
		case ARM_VST4q8_UPD:
		case ARM_VST4q16_UPD:
		case ARM_VST4q32_UPD:
			if (!Check(&S, DecodeGPRRegisterClass(Inst, wb, Address, Decoder)))
				return MCDisassembler_Fail;
			break;
		default:
			break;
	}

	// AddrMode6 Base (register+alignment)
	if (!Check(&S, DecodeAddrMode6Operand(Inst, Rn, Address, Decoder)))
		return MCDisassembler_Fail;

	// AddrMode6 Offset (register)
	switch (MCInst_getOpcode(Inst)) {
		default:
			if (Rm == 0xD)
				MCOperand_CreateReg0(Inst, 0);
			else if (Rm != 0xF) {
				if (!Check(&S, DecodeGPRRegisterClass(Inst, Rm, Address, Decoder)))
					return MCDisassembler_Fail;
			}
			break;
		case ARM_VST1d8wb_fixed:
		case ARM_VST1d16wb_fixed:
		case ARM_VST1d32wb_fixed:
		case ARM_VST1d64wb_fixed:
		case ARM_VST1q8wb_fixed:
		case ARM_VST1q16wb_fixed:
		case ARM_VST1q32wb_fixed:
		case ARM_VST1q64wb_fixed:
		case ARM_VST1d8Twb_fixed:
		case ARM_VST1d16Twb_fixed:
		case ARM_VST1d32Twb_fixed:
		case ARM_VST1d64Twb_fixed:
		case ARM_VST1d8Qwb_fixed:
		case ARM_VST1d16Qwb_fixed:
		case ARM_VST1d32Qwb_fixed:
		case ARM_VST1d64Qwb_fixed:
		case ARM_VST2d8wb_fixed:
		case ARM_VST2d16wb_fixed:
		case ARM_VST2d32wb_fixed:
		case ARM_VST2q8wb_fixed:
		case ARM_VST2q16wb_fixed:
		case ARM_VST2q32wb_fixed:
		case ARM_VST2b8wb_fixed:
		case ARM_VST2b16wb_fixed:
		case ARM_VST2b32wb_fixed:
			break;
	}


	// First input register
	switch (MCInst_getOpcode(Inst)) {
		case ARM_VST1q16:
		case ARM_VST1q32:
		case ARM_VST1q64:
		case ARM_VST1q8:
		case ARM_VST1q16wb_fixed:
		case ARM_VST1q16wb_register:
		case ARM_VST1q32wb_fixed:
		case ARM_VST1q32wb_register:
		case ARM_VST1q64wb_fixed:
		case ARM_VST1q64wb_register:
		case ARM_VST1q8wb_fixed:
		case ARM_VST1q8wb_register:
		case ARM_VST2d16:
		case ARM_VST2d32:
		case ARM_VST2d8:
		case ARM_VST2d16wb_fixed:
		case ARM_VST2d16wb_register:
		case ARM_VST2d32wb_fixed:
		case ARM_VST2d32wb_register:
		case ARM_VST2d8wb_fixed:
		case ARM_VST2d8wb_register:
			if (!Check(&S, DecodeDPairRegisterClass(Inst, Rd, Address, Decoder)))
				return MCDisassembler_Fail;
			break;
		case ARM_VST2b16:
		case ARM_VST2b32:
		case ARM_VST2b8:
		case ARM_VST2b16wb_fixed:
		case ARM_VST2b16wb_register:
		case ARM_VST2b32wb_fixed:
		case ARM_VST2b32wb_register:
		case ARM_VST2b8wb_fixed:
		case ARM_VST2b8wb_register:
			if (!Check(&S, DecodeDPairSpacedRegisterClass(Inst, Rd, Address, Decoder)))
				return MCDisassembler_Fail;
			break;
		default:
			if (!Check(&S, DecodeDPRRegisterClass(Inst, Rd, Address, Decoder)))
				return MCDisassembler_Fail;
	}

	// Second input register
	switch (MCInst_getOpcode(Inst)) {
		case ARM_VST3d8:
		case ARM_VST3d16:
		case ARM_VST3d32:
		case ARM_VST3d8_UPD:
		case ARM_VST3d16_UPD:
		case ARM_VST3d32_UPD:
		case ARM_VST4d8:
		case ARM_VST4d16:
		case ARM_VST4d32:
		case ARM_VST4d8_UPD:
		case ARM_VST4d16_UPD:
		case ARM_VST4d32_UPD:
			if (!Check(&S, DecodeDPRRegisterClass(Inst, (Rd+1)%32, Address, Decoder)))
				return MCDisassembler_Fail;
			break;
		case ARM_VST3q8:
		case ARM_VST3q16:
		case ARM_VST3q32:
		case ARM_VST3q8_UPD:
		case ARM_VST3q16_UPD:
		case ARM_VST3q32_UPD:
		case ARM_VST4q8:
		case ARM_VST4q16:
		case ARM_VST4q32:
		case ARM_VST4q8_UPD:
		case ARM_VST4q16_UPD:
		case ARM_VST4q32_UPD:
			if (!Check(&S, DecodeDPRRegisterClass(Inst, (Rd+2)%32, Address, Decoder)))
				return MCDisassembler_Fail;
			break;
		default:
			break;
	}

	// Third input register
	switch (MCInst_getOpcode(Inst)) {
		case ARM_VST3d8:
		case ARM_VST3d16:
		case ARM_VST3d32:
		case ARM_VST3d8_UPD:
		case ARM_VST3d16_UPD:
		case ARM_VST3d32_UPD:
		case ARM_VST4d8:
		case ARM_VST4d16:
		case ARM_VST4d32:
		case ARM_VST4d8_UPD:
		case ARM_VST4d16_UPD:
		case ARM_VST4d32_UPD:
			if (!Check(&S, DecodeDPRRegisterClass(Inst, (Rd+2)%32, Address, Decoder)))
				return MCDisassembler_Fail;
			break;
		case ARM_VST3q8:
		case ARM_VST3q16:
		case ARM_VST3q32:
		case ARM_VST3q8_UPD:
		case ARM_VST3q16_UPD:
		case ARM_VST3q32_UPD:
		case ARM_VST4q8:
		case ARM_VST4q16:
		case ARM_VST4q32:
		case ARM_VST4q8_UPD:
		case ARM_VST4q16_UPD:
		case ARM_VST4q32_UPD:
			if (!Check(&S, DecodeDPRRegisterClass(Inst, (Rd+4)%32, Address, Decoder)))
				return MCDisassembler_Fail;
			break;
		default:
			break;
	}

	// Fourth input register
	switch (MCInst_getOpcode(Inst)) {
		case ARM_VST4d8:
		case ARM_VST4d16:
		case ARM_VST4d32:
		case ARM_VST4d8_UPD:
		case ARM_VST4d16_UPD:
		case ARM_VST4d32_UPD:
			if (!Check(&S, DecodeDPRRegisterClass(Inst, (Rd+3)%32, Address, Decoder)))
				return MCDisassembler_Fail;
			break;
		case ARM_VST4q8:
		case ARM_VST4q16:
		case ARM_VST4q32:
		case ARM_VST4q8_UPD:
		case ARM_VST4q16_UPD:
		case ARM_VST4q32_UPD:
			if (!Check(&S, DecodeDPRRegisterClass(Inst, (Rd+6)%32, Address, Decoder)))
				return MCDisassembler_Fail;
			break;
		default:
			break;
	}

	return S;
}